

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O0

void HTS_Engine_initialize(HTS_Engine *engine)

{
  undefined8 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  *(undefined1 *)(in_RDI + 3) = 0;
  in_RDI[4] = 0x3ff0000000000000;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[8] = 0x3ff0000000000000;
  *(undefined1 *)(in_RDI + 7) = 0;
  in_RDI[9] = 0;
  *(undefined1 *)(in_RDI + 10) = 0;
  in_RDI[0xb] = 0;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  in_RDI[0x10] = 0;
  HTS_Audio_initialize((HTS_Audio *)(in_RDI + 0x11));
  HTS_ModelSet_initialize((HTS_ModelSet *)(in_RDI + 0x16));
  HTS_Label_initialize((HTS_Label *)(in_RDI + 0x25));
  HTS_SStreamSet_initialize((HTS_SStreamSet *)(in_RDI + 0x27));
  HTS_PStreamSet_initialize((HTS_PStreamSet *)(in_RDI + 0x2d));
  HTS_GStreamSet_initialize((HTS_GStreamSet *)(in_RDI + 0x30));
  return;
}

Assistant:

void HTS_Engine_initialize(HTS_Engine * engine)
{
   /* global */
   engine->condition.sampling_frequency = 0;
   engine->condition.fperiod = 0;
   engine->condition.audio_buff_size = 0;
   engine->condition.stop = FALSE;
   engine->condition.volume = 1.0;
   engine->condition.msd_threshold = NULL;
   engine->condition.gv_weight = NULL;

   /* duration */
   engine->condition.speed = 1.0;
   engine->condition.phoneme_alignment_flag = FALSE;

   /* spectrum */
   engine->condition.stage = 0;
   engine->condition.use_log_gain = FALSE;
   engine->condition.alpha = 0.0;
   engine->condition.beta = 0.0;

   /* log F0 */
   engine->condition.additional_half_tone = 0.0;

   /* interpolation weights */
   engine->condition.duration_iw = NULL;
   engine->condition.parameter_iw = NULL;
   engine->condition.gv_iw = NULL;

   /* initialize audio */
   HTS_Audio_initialize(&engine->audio);
   /* initialize model set */
   HTS_ModelSet_initialize(&engine->ms);
   /* initialize label list */
   HTS_Label_initialize(&engine->label);
   /* initialize state sequence set */
   HTS_SStreamSet_initialize(&engine->sss);
   /* initialize pstream set */
   HTS_PStreamSet_initialize(&engine->pss);
   /* initialize gstream set */
   HTS_GStreamSet_initialize(&engine->gss);
}